

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O2

int zt_threadpool_kill(zt_threadpool *tpool)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  int iVar2;
  long lVar3;
  int k;
  undefined4 local_24;
  
  _k = CONCAT44((int)((ulong)in_RAX >> 0x20),1);
  tpool->kill = 1;
  if (_zt_threads_cond_cbs.signal != (_func_int_zt_threads_cond_ptr_int *)0x0) {
    (*_zt_threads_cond_cbs.signal)(tpool->iput_cond,1);
    if (_zt_threads_cond_cbs.signal != (_func_int_zt_threads_cond_ptr_int *)0x0) {
      (*_zt_threads_cond_cbs.signal)(tpool->oput_cond,1);
    }
  }
  for (lVar3 = 0; lVar3 < tpool->min_threads; lVar3 = lVar3 + 1) {
    if ((_zt_threadpool_cbs.iput_loop != (_func_void_ptr_void_ptr *)0x0) &&
       (_zt_threads_cntrl_cbs.join != (_func_int_zt_threads_thread_ptr_void_ptr_ptr *)0x0)) {
      (*_zt_threads_cntrl_cbs.join)(tpool->iput_threads[lVar3],(void **)0x0);
    }
    if ((_zt_threadpool_cbs.oput_loop != (_func_void_ptr_void_ptr *)0x0) &&
       (_zt_threads_cntrl_cbs.join != (_func_int_zt_threads_thread_ptr_void_ptr_ptr *)0x0)) {
      (*_zt_threads_cntrl_cbs.join)(tpool->oput_threads[lVar3],(void **)0x0);
    }
  }
  _k = CONCAT44((int)lVar3,k);
  if (tpool->oput_fd_sigs[1] < 0) {
    iVar2 = 0;
  }
  else {
    sVar1 = write(tpool->oput_fd_sigs[1],&k,1);
    iVar2 = (int)(sVar1 >> 0x3f);
  }
  if (-1 < tpool->iput_fd_sigs[1]) {
    sVar1 = write(tpool->iput_fd_sigs[1],&local_24,1);
    if (sVar1 < 0) {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int
zt_threadpool_kill(zt_threadpool *tpool) {
    int i;
    int k   = 1;
    int ret = 0;

    tpool->kill = 1;

    /* signal all threads, and let them die */
    zt_threads_cond_signal(tpool->iput_cond, 1);
    zt_threads_cond_signal(tpool->oput_cond, 1);

    for (i = 0; i < tpool->min_threads; i++) {
        if (_zt_threadpool_cbs.iput_loop) {
            zt_threads_join(tpool->iput_threads[i], NULL);
        }

        if (_zt_threadpool_cbs.oput_loop) {
            zt_threads_join(tpool->oput_threads[i], NULL);
        }
    }

    if (tpool->oput_fd_sigs[1] >= 0) {
        if (write(tpool->oput_fd_sigs[1], &k, 1) < 0) {
            ret = -1;
        }
    }

    if (tpool->iput_fd_sigs[1] >= 0) {
        if (write(tpool->iput_fd_sigs[1], &i, 1) < 0) {
            ret = -1;
        }
    }

    return ret;
}